

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O0

void __thiscall MeasurementToString_simple_Test::TestBody(MeasurementToString_simple_Test *this)

{
  bool bVar1;
  precise_measurement *measure;
  char *pcVar2;
  measurement *measure_00;
  uint64_t in_RCX;
  string *__return_storage_ptr__;
  AssertHelper local_c8;
  Message local_c0;
  string local_b8;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  measurement meas;
  Message local_70 [3];
  string local_58;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  precise_measurement pm;
  MeasurementToString_simple_Test *this_local;
  
  units::precise_measurement::precise_measurement
            ((precise_measurement *)&gtest_ar.message_,45.0,(precise_unit *)units::precise::m);
  measure = (precise_measurement *)units::getDefaultFlags();
  __return_storage_ptr__ = &local_58;
  units::to_string_abi_cxx11_(__return_storage_ptr__,(units *)&gtest_ar.message_,measure,in_RCX);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_38,"to_string(pm)","\"45 m\"",__return_storage_ptr__,
             (char (*) [5])"45 m");
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    __return_storage_ptr__ = (string *)0x49;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&meas.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&meas.units_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&meas.units_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  join_0x00000000_0x00001200_ = units::operator*(45.0,(unit *)&units::m);
  measure_00 = (measurement *)units::getDefaultFlags();
  units::to_string_abi_cxx11_
            (&local_b8,(units *)&gtest_ar_1.message_,measure_00,(uint64_t)__return_storage_ptr__);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_98,"to_string(meas)","\"45 m\"",&local_b8,(char (*) [5])"45 m");
  std::__cxx11::string::~string((string *)&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  return;
}

Assistant:

TEST(MeasurementToString, simple)
{
    auto pm = precise_measurement(45.0, precise::m);
    EXPECT_EQ(to_string(pm), "45 m");
    auto meas = 45.0 * m;
    EXPECT_EQ(to_string(meas), "45 m");
}